

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExporterT.hh
# Opt level: O2

HalfedgeHandle __thiscall
OpenMesh::IO::ExporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_>::getHeh
          (ExporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_> *this,FaceHandle _fh
          ,VertexHandle _vh)

{
  GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
  local_30;
  
  local_30.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_ = 0xffffffff;
  local_30.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ = (mesh_ptr)this->mesh_;
  local_30.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.idx_ =
       *(BaseHandle *)
        (*(long *)&(local_30.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_)->
                   field_0xf8 + (long)(int)_fh.super_BaseHandle.idx_ * 4);
  local_30.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_ = 0;
  local_30.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.super_BaseHandle.idx_ =
       local_30.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
       idx_;
  while ((-1 < (int)local_30.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.
                    super_BaseHandle.idx_ &&
         (((local_30.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_ == 0 ||
           (local_30.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.
            super_BaseHandle.idx_ !=
            local_30.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.super_BaseHandle.
            idx_)) &&
          ((BaseHandle)
           *(int *)((ulong)(((uint)local_30.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>
                                   .heh_.super_BaseHandle.idx_ & 1) << 4) + 4 +
                   (ulong)((uint)local_30.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.
                                 heh_.super_BaseHandle.idx_ >> 1) * 0x20 +
                   *(long *)&(this->mesh_->super_Mesh).
                             super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                             .super_PolyConnectivity.field_0xe0) != _vh.super_BaseHandle.idx_))))) {
    Iterators::
    GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
    ::operator++(&local_30);
  }
  return (HalfedgeHandle)
         local_30.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.super_BaseHandle.
         idx_;
}

Assistant:

HalfedgeHandle getHeh(FaceHandle _fh, VertexHandle _vh) const override
  {
    typename Mesh::ConstFaceHalfedgeIter fh_it;
    for(fh_it = mesh_.cfh_iter(_fh); fh_it.is_valid();++fh_it)
    {
      if(mesh_.to_vertex_handle(*fh_it) == _vh)
        return *fh_it;
    }
    return *fh_it;
  }